

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void ConvertTexture(shared_ptr<Assimp::COB::Texture> *tex,aiMaterial *out,aiTextureType type)

{
  aiMaterial *this;
  element_type *peVar1;
  undefined1 local_420 [8];
  aiString path;
  aiTextureType type_local;
  aiMaterial *out_local;
  shared_ptr<Assimp::COB::Texture> *tex_local;
  
  path.data._1016_4_ = type;
  unique0x100000a9 = out;
  peVar1 = std::__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)tex);
  aiString::aiString((aiString *)local_420,&peVar1->path);
  aiMaterial::AddProperty
            (stack0xffffffffffffffe8,(aiString *)local_420,"$tex.file",path.data._1016_4_,0);
  this = stack0xffffffffffffffe8;
  peVar1 = std::__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)tex);
  aiMaterial::AddProperty(this,&peVar1->transform,1,"$tex.uvtrafo",path.data._1016_4_,0);
  return;
}

Assistant:

void ConvertTexture(std::shared_ptr< Texture > tex, aiMaterial* out, aiTextureType type)
{
    const aiString path( tex->path );
    out->AddProperty(&path,AI_MATKEY_TEXTURE(type,0));
    out->AddProperty(&tex->transform,1,AI_MATKEY_UVTRANSFORM(type,0));
}